

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O3

void Extra_TruthShrink(uint *pOut,uint *pIn,int nVars,int nVarsAll,uint Phase)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint iVar;
  int iVar5;
  
  if (nVarsAll < 1) {
    uVar2 = 1;
    if (nVars != 0) goto LAB_0049d56d;
  }
  else {
    uVar2 = 0;
    iVar5 = 0;
    uVar4 = 0;
    do {
      if ((Phase >> (uVar4 & 0x1f) & 1) != 0) {
        if (iVar5 < (int)uVar4) {
          puVar1 = pIn;
          iVar = uVar4;
          do {
            pIn = pOut;
            pOut = puVar1;
            iVar = iVar - 1;
            Extra_TruthSwapAdjacentVars(pIn,pOut,nVarsAll,iVar);
            puVar1 = pIn;
          } while (iVar5 < (int)iVar);
          uVar2 = (uVar2 + uVar4) - iVar5;
        }
        iVar5 = iVar5 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != nVarsAll);
    if (iVar5 != nVars) {
LAB_0049d56d:
      __assert_fail("Var == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                    ,0x11b,
                    "void Extra_TruthShrink(unsigned int *, unsigned int *, int, int, unsigned int)"
                   );
    }
    if ((uVar2 & 1) != 0) {
      return;
    }
    uVar2 = 1 << ((char)nVarsAll - 5U & 0x1f);
    if (nVarsAll < 6) {
      uVar2 = 1;
    }
    if ((int)uVar2 < 1) {
      return;
    }
  }
  uVar3 = (ulong)uVar2 + 1;
  do {
    pOut[uVar3 - 2] = pIn[uVar3 - 2];
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return;
}

Assistant:

void Extra_TruthShrink( unsigned * pOut, unsigned * pIn, int nVars, int nVarsAll, unsigned Phase )
{
    unsigned * pTemp;
    int i, k, Var = 0, Counter = 0;
    for ( i = 0; i < nVarsAll; i++ )
        if ( Phase & (1 << i) )
        {
            for ( k = i-1; k >= Var; k-- )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVarsAll, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                Counter++;
            }
            Var++;
        }
    assert( Var == nVars );
    // swap if it was moved an even number of times
    if ( !(Counter & 1) )
        Extra_TruthCopy( pOut, pIn, nVarsAll );
}